

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

Port * __thiscall
kratos::Generator::port(Generator *this,PortPackedStruct *port,string *port_name,bool check_param)

{
  undefined7 in_register_00000009;
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_54 [20];
  shared_ptr<kratos::PortPackedStruct> p;
  
  p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = (undefined4)CONCAT71(in_register_00000009,check_param);
  local_54._0_4_ = (port->super_Port).direction_;
  local_54._4_8_ = this;
  (*(port->super_Port).super_Var.super_IRNode._vptr_IRNode[0x2e])(local_68);
  std::
  make_shared<kratos::PortPackedStruct,kratos::Generator*,kratos::PortDirection,std::__cxx11::string_const&,std::shared_ptr<kratos::PackedStruct>>
            ((Generator **)(local_54 + 0xc),(PortDirection *)(local_54 + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_54,
             (shared_ptr<kratos::PackedStruct> *)port_name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  (*(this->super_IRNode)._vptr_IRNode[7])(this,port_name);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::PortPackedStruct>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,port_name,(shared_ptr<kratos::PortPackedStruct> *)(local_54 + 0xc));
  Var::copy_meta_data((Var *)port,(Var *)local_54._12_8_,
                      p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_1_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  return (Port *)local_54._12_8_;
}

Assistant:

Port &Generator::port(const PortPackedStruct &port, const std::string &port_name,
                      bool check_param) {
    auto p = std::make_shared<PortPackedStruct>(this, port.port_direction(), port_name,
                                                port.packed_struct());
    add_port_name(port_name);
    vars_.emplace(port_name, p);

    port.copy_meta_data(p.get(), check_param);

    return *p;
}